

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_file.cpp
# Opt level: O2

ssize_t libtorrent::aux::anon_unknown_1::copy_range
                  (int fd_in,int fd_out,off_t in_offset,int64_t len,copy_range_mode *m,
                  storage_error *se)

{
  int val;
  ssize_t sVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  off_t in_offset_local;
  copy_range_mode *local_40;
  off_t out_offset;
  
  in_offset_local = in_offset;
  if (m->use_fallback == true) {
    sVar1 = copy_range_fallback(fd_in,fd_out,in_offset,len,se);
    return sVar1;
  }
  lVar4 = 0;
  local_40 = m;
  out_offset = in_offset;
  while( true ) {
    lVar2 = copy_file_range(fd_in,&in_offset_local,fd_out,&out_offset,len,0);
    if (lVar2 < 0) {
      piVar3 = __errno_location();
      val = *piVar3;
      if ((val == 0x5f) || (val == 0x12)) {
        local_40->use_fallback = true;
        sVar1 = copy_range_fallback(fd_in,fd_out,in_offset_local,len,se);
      }
      else {
        se->operation = file_copy;
        boost::system::error_code::assign
                  (&se->ec,val,
                   &boost::system::detail::cat_holder<void>::system_category_instance.
                    super_error_category);
        sVar1 = -1;
      }
      return sVar1;
    }
    lVar4 = lVar4 + lVar2;
    if (lVar2 == 0) break;
    len = len - lVar2;
    if (len < 1) {
      return lVar4;
    }
  }
  return lVar4;
}

Assistant:

ssize_t copy_range(int const fd_in, int const fd_out, off_t in_offset
	, std::int64_t len, copy_range_mode* const m, storage_error& se)
{
#if TORRENT_HAS_COPY_FILE_RANGE
	if (m->use_fallback)
		return copy_range_fallback(fd_in, fd_out, in_offset, len, se);

	ssize_t total_copied = 0;
	off_t out_offset = in_offset;
	ssize_t ret = 0;
	do
	{
		ret = ::copy_file_range(fd_in, &in_offset
			, fd_out, &out_offset, std::size_t(len), 0);
		if (ret < 0)
		{
			int const err = errno;
			if (err == EXDEV || err == ENOTSUP)
			{
				m->use_fallback = true;
				return copy_range_fallback(fd_in, fd_out, in_offset, len, se);
			}
			se.operation = operation_t::file_copy;
			se.ec.assign(err, system_category());
			return -1;
		}

		len -= ret;
		total_copied += ret;
	} while (len > 0 && ret > 0);
	return total_copied;
#else
	TORRENT_UNUSED(m);
	return copy_range_fallback(fd_in, fd_out, in_offset, len, se);
#endif
}